

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::getDerefTypeId(Builder *this,Id resultId)

{
  bool bVar1;
  Id IVar2;
  Instruction *this_00;
  Id typeId;
  Id resultId_local;
  Builder *this_local;
  
  IVar2 = getTypeId(this,resultId);
  bVar1 = isPointerType(this,IVar2);
  if (!bVar1) {
    __assert_fail("isPointerType(typeId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x546,"Id spv::Builder::getDerefTypeId(Id) const");
  }
  this_00 = Module::getInstruction(&this->module,IVar2);
  IVar2 = spv::Instruction::getIdOperand(this_00,1);
  return IVar2;
}

Assistant:

Id Builder::getDerefTypeId(Id resultId) const
{
    Id typeId = getTypeId(resultId);
    assert(isPointerType(typeId));

    return module.getInstruction(typeId)->getIdOperand(1);
}